

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O1

Am_Wrapper * __thiscall Am_Gesture_Trainer_Data::Make_Unique(Am_Gesture_Trainer_Data *this)

{
  uint uVar1;
  Am_Gesture_Trainer_Data *this_00;
  
  uVar1 = (this->super_Am_Wrapper).refs;
  this_00 = this;
  if (uVar1 != 1) {
    uVar1 = uVar1 - 1;
    (this->super_Am_Wrapper).refs = uVar1;
    if (uVar1 == 0) {
      (*(this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(this);
    }
    this_00 = (Am_Gesture_Trainer_Data *)operator_new(0x30);
    Am_Gesture_Trainer_Data(this_00,this);
  }
  return &this_00->super_Am_Wrapper;
}

Assistant:

Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data()
{
  head = tail = nullptr;
  nclasses = 0;
  cached_classifier = nullptr;
}